

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O1

void ERR_add_error_data(int num,...)

{
  char in_AL;
  undefined8 *puVar1;
  size_t sVar2;
  char *dst;
  undefined8 *puVar3;
  size_t sVar4;
  uint uVar5;
  undefined8 in_RCX;
  ulong uVar6;
  undefined8 in_RDX;
  ulong uVar7;
  ulong uVar8;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar9;
  bool bVar11;
  bool bVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 *local_130;
  uint local_118;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  size_t sVar10;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_130 = (undefined8 *)&stack0x00000008;
  uVar5 = 8;
  uVar8 = (ulong)(uint)num;
  bVar12 = num != 0;
  local_e8[1] = in_RSI;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (num == 0) {
    uVar7 = 0;
  }
  else {
    local_118 = 8;
    bVar12 = true;
    uVar7 = 0;
    puVar3 = local_130;
    uVar6 = 1;
    do {
      if (local_118 < 0x29) {
        uVar9 = (ulong)local_118;
        local_118 = local_118 + 8;
        puVar1 = (undefined8 *)((long)local_e8 + uVar9);
      }
      else {
        puVar1 = puVar3;
        puVar3 = puVar3 + 1;
      }
      if ((char *)*puVar1 != (char *)0x0) {
        sVar2 = strlen((char *)*puVar1);
        sVar10 = sVar2;
        if (CARRY8(uVar7,sVar2)) {
          sVar10 = 0;
        }
        uVar9 = sVar10 + uVar7;
        bVar11 = CARRY8(sVar2,uVar7);
        uVar7 = uVar9;
        if (bVar11) break;
      }
      bVar12 = uVar6 < uVar8;
      bVar11 = uVar6 != uVar8;
      uVar6 = uVar6 + 1;
    } while (bVar11);
  }
  if ((!bVar12) && (uVar7 != 0xffffffffffffffff)) {
    dst = (char *)malloc(uVar7 + 1);
    if (dst != (char *)0x0) {
      *dst = '\0';
      if (num != 0) {
        do {
          uVar6 = (ulong)uVar5;
          if (uVar6 < 0x29) {
            uVar5 = uVar5 + 8;
            puVar3 = (undefined8 *)((long)local_e8 + uVar6);
          }
          else {
            puVar3 = local_130;
            local_130 = local_130 + 1;
          }
          if (((char *)*puVar3 != (char *)0x0) &&
             (sVar4 = OPENSSL_strlcat(dst,(char *)*puVar3,uVar7 + 1), uVar7 < sVar4)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                          ,0x288,"void err_add_error_vdata(unsigned int, __va_list_tag *)");
          }
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      err_set_error_data(dst);
    }
  }
  return;
}

Assistant:

void ERR_add_error_data(unsigned count, ...) {
  va_list args;
  va_start(args, count);
  err_add_error_vdata(count, args);
  va_end(args);
}